

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O0

void plugin_manager_destroy(plugin_manager manager)

{
  long *in_RDI;
  set_cb_iterate_args in_stack_00000010;
  set_cb_iterate in_stack_00000018;
  set in_stack_00000020;
  
  if ((in_RDI[3] != 0) && (*(long *)(in_RDI[3] + 8) != 0)) {
    (**(code **)(in_RDI[3] + 8))(in_RDI,in_RDI[4]);
  }
  if (in_RDI[2] != 0) {
    set_iterate(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  }
  if (*in_RDI != 0) {
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  if (in_RDI[2] != 0) {
    set_destroy((set)manager);
    in_RDI[2] = 0;
  }
  if (in_RDI[1] != 0) {
    environment_variable_path_destroy((char *)0x1212c9);
    in_RDI[1] = 0;
  }
  if (in_RDI[5] != 0) {
    plugin_loader_destroy((plugin_loader_conflict)0x1212ed);
    in_RDI[5] = 0;
  }
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  return;
}

Assistant:

void plugin_manager_destroy(plugin_manager manager)
{
	/* If there's a destroy callback, probably the plugin manager needs a complex destroy algorithm */
	if (manager->iface != NULL && manager->iface->destroy != NULL)
	{
		manager->iface->destroy(manager, manager->impl);
	}

	/* Unload and destroy each plugin. The destroy callback is executed before this so the user can clear the
	* plugin set and this will do nothing if the set has been emptied before with plugin_manager_clear */
	if (manager->plugins != NULL)
	{
		set_iterate(manager->plugins, &plugin_manager_destroy_cb, NULL);
	}

	/* Clear the name */
	if (manager->name != NULL)
	{
		free(manager->name);
		manager->name = NULL;
	}

	/* Destroy the plugin set */
	if (manager->plugins != NULL)
	{
		set_destroy(manager->plugins);
		manager->plugins = NULL;
	}

	/* Clear the library path */
	if (manager->library_path != NULL)
	{
		environment_variable_path_destroy(manager->library_path);
		manager->library_path = NULL;
	}

	/* Clear the loader */
	if (manager->l != NULL)
	{
		plugin_loader_destroy(manager->l);
		manager->l = NULL;
	}

	/* Nullify the rest of parameters that do not need deallocation */
	manager->iface = NULL;
	manager->impl = NULL;
}